

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall QXmlStreamReaderPrivate::resolveTag(QXmlStreamReaderPrivate *this)

{
  QXmlStreamAttributes *this_00;
  undefined8 *puVar1;
  qsizetype *pqVar2;
  long lVar3;
  DtdAttribute *pDVar4;
  QString *pQVar5;
  long lVar6;
  long lVar7;
  Tag *pTVar8;
  Attribute *pAVar9;
  undefined8 uVar10;
  bool bVar11;
  bool bVar12;
  long size;
  char16_t *pcVar13;
  NamespaceDeclaration *pNVar14;
  long lVar15;
  pointer pQVar16;
  pointer pQVar17;
  QArrayData *pQVar18;
  qsizetype qVar19;
  QString *pQVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  char *pcVar24;
  qsizetype qVar25;
  DtdAttribute *pDVar26;
  long lVar27;
  long in_FS_OFFSET;
  QStringView rhs;
  QStringView rhs_00;
  QStringView rhs_01;
  QStringView rhs_02;
  QStringView rhs_03;
  QStringView rhs_04;
  QStringView rhs_05;
  QStringView prefix;
  QStringView prefix_00;
  QStringView rhs_06;
  QStringView rhs_07;
  QStringView rhs_08;
  QStringView prefix_01;
  QAnyStringView a;
  QLatin1StringView lhs;
  QLatin1StringView lhs_00;
  QLatin1StringView lhs_01;
  QLatin1StringView lhs_02;
  QLatin1StringView lhs_03;
  QLatin1StringView lhs_04;
  QLatin1StringView lhs_05;
  QStringView lhs_06;
  QStringView lhs_07;
  QStringView lhs_08;
  QXmlStreamAttribute attribute;
  QString *local_138;
  long local_128;
  long local_120;
  QArrayDataPointer<char16_t> local_c8;
  undefined1 local_a8 [112];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (this->attributeStack).tos;
  size = lVar3 + 1;
  if ((this->field_0x3a9 & 0x10) != 0) {
    pDVar4 = (this->dtdAttributes).data;
    lVar22 = (this->dtdAttributes).tos;
    if (pDVar4 != pDVar4 + lVar22 + 1) {
      pDVar26 = pDVar4;
      do {
        if ((((pDVar26->isNamespaceAttribute == true) &&
             ((pDVar26->defaultValue).m_string != (QString *)0x0)) &&
            (bVar11 = QtPrivate::operator!=(&pDVar26->tagName,&this->qualifiedName), !bVar11)) &&
           ((pDVar26->attributeQualifiedName).m_string != (QString *)0x0)) {
          if (lVar3 < 0) {
            lVar15 = 0;
          }
          else {
            lVar23 = 0;
            lVar21 = 0;
            do {
              puVar1 = (undefined8 *)((long)&(((this->attributeStack).data)->key).pos + lVar23);
              local_a8._8_8_ = *puVar1;
              local_a8._16_8_ = puVar1[1];
              local_a8._0_8_ = &this->textBuffer;
              bVar11 = QtPrivate::operator!=
                                 ((XmlStringRef *)local_a8,&pDVar26->attributeQualifiedName);
              lVar15 = lVar21;
              if (!bVar11) break;
              lVar21 = lVar21 + 1;
              lVar23 = lVar23 + 0x30;
              lVar15 = size;
            } while (lVar3 + 1 != lVar21);
          }
          if (lVar15 == size) {
            lVar15 = (pDVar26->attributePrefix).m_size;
            if (((lVar15 == 0) &&
                (pQVar20 = (pDVar26->attributeName).m_string, pQVar20 != (QString *)0x0)) &&
               ((pDVar26->attributeName).m_size == 5)) {
              pcVar13 = (pQVar20->d).ptr;
              if (pcVar13 == (char16_t *)0x0) {
                pcVar13 = &QString::_empty;
              }
              rhs_01.m_data = pcVar13 + (pDVar26->attributeName).m_pos;
              rhs_01.m_size = 5;
              lhs_01.m_data = "xmlns";
              lhs_01.m_size = 5;
              bVar11 = QtPrivate::equalStrings(lhs_01,rhs_01);
              if (bVar11) {
                pNVar14 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
                lVar21 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos;
                lVar15 = lVar21 + 1;
                lVar23 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.cap;
                if (lVar23 <= lVar15) {
                  lVar21 = lVar21 + 2;
                  lVar15 = lVar23 * 2;
                  if (lVar21 != lVar15 && SBORROW8(lVar21,lVar15) == lVar21 + lVar23 * -2 < 0) {
                    lVar15 = lVar21;
                  }
                  (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.cap = lVar15;
                  pNVar14 = (NamespaceDeclaration *)realloc(pNVar14,lVar15 * 0x30);
                  (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data = pNVar14;
                  if (pNVar14 == (NamespaceDeclaration *)0x0) {
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      qBadAlloc();
                    }
                    goto LAB_00392c1e;
                  }
                  lVar15 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos + 1;
                }
                (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos = lVar15;
                pqVar2 = &pNVar14[lVar15].namespaceUri.m_pos;
                *pqVar2 = 0;
                pqVar2[1] = 0;
                pqVar2 = &pNVar14[lVar15].prefix.m_size;
                *pqVar2 = 0;
                pqVar2[1] = 0;
                pNVar14[lVar15].prefix.m_string = (QString *)0x0;
                pNVar14[lVar15].prefix.m_pos = 0;
                pQVar20 = (pDVar26->defaultValue).m_string;
                lVar21 = (pDVar26->defaultValue).m_pos;
                lVar23 = (pDVar26->defaultValue).m_size;
                if (pQVar20 != (QString *)0x0) {
                  if (lVar23 == 0x24) {
                    pcVar13 = (pQVar20->d).ptr;
                    if (pcVar13 == (char16_t *)0x0) {
                      pcVar13 = &QString::_empty;
                    }
                    qVar25 = 0x24;
                    qVar19 = 0x24;
                    pcVar24 = "http://www.w3.org/XML/1998/namespace";
                  }
                  else {
                    if (lVar23 != 0x1d) goto LAB_00392188;
                    pcVar13 = (pQVar20->d).ptr;
                    if (pcVar13 == (char16_t *)0x0) {
                      pcVar13 = &QString::_empty;
                    }
                    qVar25 = 0x1d;
                    qVar19 = 0x1d;
                    pcVar24 = "http://www.w3.org/2000/xmlns/";
                  }
                  rhs_05.m_data = pcVar13 + lVar21;
                  rhs_05.m_size = qVar19;
                  lhs_05.m_data = pcVar24;
                  lhs_05.m_size = qVar25;
                  bVar11 = QtPrivate::equalStrings(lhs_05,rhs_05);
                  if (bVar11) {
                    QCoreApplication::translate
                              ((QString *)local_a8,"QXmlStream","Illegal namespace declaration.",
                               (char *)0x0,-1);
                    this->error = NotWellFormedError;
                    QString::operator=(&this->errorString,(QString *)local_a8);
                    this->type = Invalid;
                    if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
                      LOCK();
                      (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i
                           = (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
                      }
                    }
                    goto LAB_0039209c;
                  }
                }
LAB_00392188:
                pNVar14[lVar15].namespaceUri.m_string = pQVar20;
                pNVar14[lVar15].namespaceUri.m_pos = lVar21;
                pNVar14[lVar15].namespaceUri.m_size = lVar23;
                goto LAB_0039209c;
              }
            }
            pQVar20 = (pDVar26->attributePrefix).m_string;
            if (lVar15 == 5 && pQVar20 != (QString *)0x0) {
              pcVar13 = (pQVar20->d).ptr;
              if (pcVar13 == (char16_t *)0x0) {
                pcVar13 = &QString::_empty;
              }
              rhs.m_data = pcVar13 + (pDVar26->attributePrefix).m_pos;
              rhs.m_size = 5;
              lhs.m_data = "xmlns";
              lhs.m_size = 5;
              bVar11 = QtPrivate::equalStrings(lhs,rhs);
              if (bVar11) {
                pNVar14 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data;
                lVar21 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos;
                lVar15 = lVar21 + 1;
                lVar23 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.cap;
                if (lVar23 <= lVar15) {
                  lVar21 = lVar21 + 2;
                  lVar15 = lVar23 * 2;
                  if (lVar21 != lVar15 && SBORROW8(lVar21,lVar15) == lVar21 + lVar23 * -2 < 0) {
                    lVar15 = lVar21;
                  }
                  (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.cap = lVar15;
                  pNVar14 = (NamespaceDeclaration *)realloc(pNVar14,lVar15 * 0x30);
                  (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data = pNVar14;
                  if (pNVar14 == (NamespaceDeclaration *)0x0) {
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      qBadAlloc();
                    }
                    goto LAB_00392c1e;
                  }
                  lVar15 = (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos + 1;
                }
                (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos = lVar15;
                pqVar2 = &pNVar14[lVar15].namespaceUri.m_pos;
                *pqVar2 = 0;
                pqVar2[1] = 0;
                pqVar2 = &pNVar14[lVar15].prefix.m_size;
                *pqVar2 = 0;
                pqVar2[1] = 0;
                pNVar14[lVar15].prefix.m_string = (QString *)0x0;
                pNVar14[lVar15].prefix.m_pos = 0;
                pQVar20 = (pDVar26->attributeName).m_string;
                lVar21 = (pDVar26->attributeName).m_pos;
                lVar23 = (pDVar26->attributeName).m_size;
                pQVar5 = (pDVar26->defaultValue).m_string;
                lVar6 = (pDVar26->defaultValue).m_pos;
                lVar7 = (pDVar26->defaultValue).m_size;
                if (pQVar20 == (QString *)0x0) {
                  lVar27 = 0;
                  bVar11 = false;
                }
                else if (lVar23 == 3) {
                  pcVar13 = (pQVar20->d).ptr;
                  if (pcVar13 == (char16_t *)0x0) {
                    pcVar13 = &QString::_empty;
                  }
                  rhs_00.m_data = pcVar13 + lVar21;
                  rhs_00.m_size = 3;
                  lhs_00.m_data = "xml";
                  lhs_00.m_size = 3;
                  bVar11 = QtPrivate::equalStrings(lhs_00,rhs_00);
                  lVar27 = 3;
                }
                else {
                  bVar11 = false;
                  lVar27 = lVar23;
                }
                if (pQVar5 == (QString *)0x0) {
                  if (bVar11 == false && lVar7 != 0) goto LAB_00391fa3;
LAB_00391fee:
                  QCoreApplication::translate
                            ((QString *)local_a8,"QXmlStream","Illegal namespace declaration.",
                             (char *)0x0,-1);
                  this->error = NotWellFormedError;
                  QString::operator=(&this->errorString,(QString *)local_a8);
                  this->type = Invalid;
                  if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
                    LOCK();
                    (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                         (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
                    }
                  }
                }
                else {
                  if (lVar7 == 0x24) {
                    pcVar13 = (pQVar5->d).ptr;
                    if (pcVar13 == (char16_t *)0x0) {
                      pcVar13 = &QString::_empty;
                    }
                    rhs_02.m_data = pcVar13 + lVar6;
                    rhs_02.m_size = 0x24;
                    lhs_02.m_data = "http://www.w3.org/XML/1998/namespace";
                    lhs_02.m_size = 0x24;
                    bVar12 = QtPrivate::equalStrings(lhs_02,rhs_02);
                    if (bVar11 == bVar12) goto LAB_00391fa3;
                    goto LAB_00391fee;
                  }
                  if ((bVar11 != false) || (lVar7 == 0)) goto LAB_00391fee;
                  if (lVar7 == 0x1d) {
                    pcVar13 = (pQVar5->d).ptr;
                    if (pcVar13 == (char16_t *)0x0) {
                      pcVar13 = &QString::_empty;
                    }
                    rhs_03.m_data = pcVar13 + lVar6;
                    rhs_03.m_size = 0x1d;
                    lhs_03.m_data = "http://www.w3.org/2000/xmlns/";
                    lhs_03.m_size = 0x1d;
                    bVar11 = QtPrivate::equalStrings(lhs_03,rhs_03);
                    if (bVar11) goto LAB_00391fee;
                  }
LAB_00391fa3:
                  if (pQVar20 == (QString *)0x0) {
                    pcVar13 = (char16_t *)0x0;
                  }
                  else {
                    pcVar13 = (pQVar20->d).ptr;
                    if (pcVar13 == (char16_t *)0x0) {
                      pcVar13 = &QString::_empty;
                    }
                    pcVar13 = pcVar13 + lVar21;
                  }
                  if ((lVar27 == 5) &&
                     (rhs_04.m_data = pcVar13, rhs_04.m_size = 5, lhs_04.m_data = "xmlns",
                     lhs_04.m_size = 5, bVar11 = QtPrivate::equalStrings(lhs_04,rhs_04), bVar11))
                  goto LAB_00391fee;
                }
                pNVar14 = pNVar14 + lVar15;
                (pNVar14->prefix).m_string = pQVar20;
                (pNVar14->prefix).m_pos = lVar21;
                (pNVar14->prefix).m_size = lVar23;
                (pNVar14->namespaceUri).m_string = pQVar5;
                (pNVar14->namespaceUri).m_pos = lVar6;
                (pNVar14->namespaceUri).m_size = lVar7;
              }
            }
          }
        }
LAB_0039209c:
        bVar11 = pDVar26 != pDVar4 + lVar22;
        pDVar26 = pDVar26 + 1;
      } while (bVar11);
    }
  }
  pQVar20 = (this->prefix).m_string;
  if (pQVar20 == (QString *)0x0) {
    pcVar13 = (char16_t *)0x0;
  }
  else {
    pcVar13 = (pQVar20->d).ptr;
    if (pcVar13 == (char16_t *)0x0) {
      pcVar13 = &QString::_empty;
    }
    pcVar13 = pcVar13 + (this->prefix).m_pos;
  }
  if (pQVar20 != (QString *)0x0) {
    pQVar20 = (QString *)(this->prefix).m_size;
  }
  prefix.m_data = pcVar13;
  prefix.m_size = (qsizetype)pQVar20;
  namespaceForPrefix((XmlStringRef *)local_a8,this,prefix);
  (this->namespaceUri).m_size = local_a8._16_8_;
  (this->namespaceUri).m_string = (QString *)local_a8._0_8_;
  (this->namespaceUri).m_pos = local_a8._8_8_;
  pTVar8 = (this->super_QXmlStreamPrivateTagStack).tagStack.data;
  lVar22 = (this->super_QXmlStreamPrivateTagStack).tagStack.tos;
  pTVar8[lVar22].namespaceDeclaration.namespaceUri.m_size = local_a8._16_8_;
  pNVar14 = &pTVar8[lVar22].namespaceDeclaration;
  (pNVar14->namespaceUri).m_string = (QString *)local_a8._0_8_;
  (pNVar14->namespaceUri).m_pos = local_a8._8_8_;
  this_00 = &this->attributes;
  QList<QXmlStreamAttribute>::resize(&this_00->super_QList<QXmlStreamAttribute>,size);
  if (-1 < lVar3) {
    lVar22 = 0;
    do {
      pQVar16 = QList<QXmlStreamAttribute>::data(&this_00->super_QList<QXmlStreamAttribute>);
      pAVar9 = (this->attributeStack).data;
      lVar21 = (long)pAVar9[lVar22].key.prefix;
      lVar15 = pAVar9[lVar22].key.pos;
      if (lVar21 == 0) {
        lVar21 = 0;
        local_120 = 0;
        local_128 = 0;
        local_138 = (QString *)0x0;
      }
      else {
        local_120 = lVar21 + -1;
        local_138 = &this->textBuffer;
        local_128 = lVar15;
      }
      lVar23 = pAVar9[lVar22].key.len;
      lVar6 = pAVar9[lVar22].value.pos;
      lVar27 = (long)pAVar9[lVar22].value.prefix;
      lVar7 = pAVar9[lVar22].value.len;
      local_a8._0_8_ = (this->textBuffer).d.d;
      local_a8._8_8_ = (this->textBuffer).d.ptr;
      if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_a8._0_8_)->ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((QArrayData *)local_a8._0_8_)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar16 = pQVar16 + lVar22;
      local_a8._16_8_ = lVar23 - lVar21;
      local_a8._8_8_ = local_a8._8_8_ + (lVar15 + lVar21) * 2;
      QArrayDataPointer<char16_t>::operator=
                ((QArrayDataPointer<char16_t> *)pQVar16,(QArrayDataPointer<char16_t> *)local_a8);
      if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
        }
      }
      local_a8._0_8_ = (this->textBuffer).d.d;
      local_a8._8_8_ = (this->textBuffer).d.ptr;
      if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_a8._0_8_)->ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((QArrayData *)local_a8._0_8_)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_a8._8_8_ = local_a8._8_8_ + lVar15 * 2;
      local_a8._16_8_ = lVar23;
      QArrayDataPointer<char16_t>::operator=
                (&(pQVar16->m_qualifiedName).m_string,(QArrayDataPointer<char16_t> *)local_a8);
      if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
        }
      }
      local_a8._0_8_ = (this->textBuffer).d.d;
      local_a8._8_8_ = (this->textBuffer).d.ptr;
      if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_a8._0_8_)->ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((QArrayData *)local_a8._0_8_)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_a8._16_8_ = lVar7 - lVar27;
      local_a8._8_8_ = local_a8._8_8_ + (lVar6 + lVar27) * 2;
      QArrayDataPointer<char16_t>::operator=
                (&(pQVar16->m_value).m_string,(QArrayDataPointer<char16_t> *)local_a8);
      if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
        }
      }
      if (local_120 != 0) {
        local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        if (local_138 == (QString *)0x0) {
          local_120 = 0;
          pcVar13 = (char16_t *)0x0;
        }
        else {
          pcVar13 = (local_138->d).ptr;
          if (pcVar13 == (char16_t *)0x0) {
            pcVar13 = &QString::_empty;
          }
          pcVar13 = pcVar13 + local_128;
        }
        prefix_00.m_data = pcVar13;
        prefix_00.m_size = local_120;
        namespaceForPrefix((XmlStringRef *)local_a8,this,prefix_00);
        if ((QArrayData *)local_a8._0_8_ == (QArrayData *)0x0) {
          local_c8.d = (Data *)0x0;
          local_c8.ptr = (char16_t *)0x0;
          local_c8.size = 0;
        }
        else {
          local_c8.d = *(Data **)local_a8._0_8_;
          local_c8.ptr = *(char16_t **)(local_a8._0_8_ + 8);
          if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          local_c8.ptr = local_c8.ptr + local_a8._8_8_;
          local_c8.size = local_a8._16_8_;
        }
        QArrayDataPointer<char16_t>::operator=(&(pQVar16->m_namespaceUri).m_string,&local_c8);
        if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_c8.d)->super_QArrayData,2,0x10);
          }
        }
      }
      if (lVar22 != 0) {
        lVar21 = 0;
        lVar15 = lVar22;
        do {
          pQVar17 = QList<QXmlStreamAttribute>::data(&this_00->super_QList<QXmlStreamAttribute>);
          lVar23 = *(long *)((long)&(pQVar17->m_name).m_string.size + lVar21);
          if ((lVar23 == (pQVar16->m_name).m_string.size) &&
             (rhs_06.m_data = (pQVar16->m_name).m_string.ptr, rhs_06.m_size = lVar23,
             lhs_06.m_data =
                  *(storage_type_conflict **)((long)&(pQVar17->m_name).m_string.ptr + lVar21),
             lhs_06.m_size = lVar23, bVar11 = QtPrivate::equalStrings(lhs_06,rhs_06), bVar11)) {
            pQVar17 = QList<QXmlStreamAttribute>::data(&this_00->super_QList<QXmlStreamAttribute>);
            lVar23 = *(long *)((long)&(pQVar17->m_namespaceUri).m_string.size + lVar21);
            if ((lVar23 == (pQVar16->m_namespaceUri).m_string.size) &&
               (rhs_07.m_data = (pQVar16->m_namespaceUri).m_string.ptr, rhs_07.m_size = lVar23,
               lhs_07.m_data =
                    *(storage_type_conflict **)
                     ((long)&(pQVar17->m_namespaceUri).m_string.ptr + lVar21),
               lhs_07.m_size = lVar23, bVar11 = QtPrivate::equalStrings(lhs_07,rhs_07), bVar11)) {
              if ((this->field_0x3a9 & 0x10) == 0) {
                pQVar17 = QList<QXmlStreamAttribute>::data
                                    (&this_00->super_QList<QXmlStreamAttribute>);
                lVar23 = *(long *)((long)&(pQVar17->m_qualifiedName).m_string.size + lVar21);
                if ((lVar23 != (pQVar16->m_qualifiedName).m_string.size) ||
                   (rhs_08.m_data = (pQVar16->m_qualifiedName).m_string.ptr, rhs_08.m_size = lVar23,
                   lhs_08.m_data =
                        *(storage_type_conflict **)
                         ((long)&(pQVar17->m_qualifiedName).m_string.ptr + lVar21),
                   lhs_08.m_size = lVar23, bVar11 = QtPrivate::equalStrings(lhs_08,rhs_08), !bVar11)
                   ) goto LAB_003925cc;
              }
              QCoreApplication::translate
                        ((QString *)&local_c8,"QXmlStream","Attribute \'%1\' redefined.",(char *)0x0
                         ,-1);
              a.m_size = (pQVar16->m_qualifiedName).m_string.size | 0x8000000000000000;
              a.field_0.m_data_utf16 = (pQVar16->m_qualifiedName).m_string.ptr;
              QString::arg_impl((QString *)local_a8,(QString *)&local_c8,a,0,(QChar)0x20);
              this->error = NotWellFormedError;
              QString::operator=(&this->errorString,(QString *)local_a8);
              this->type = Invalid;
              if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
                }
              }
              if (&(local_c8.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     -1;
                UNLOCK();
                if (((local_c8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                    0) {
                  QArrayData::deallocate(&(local_c8.d)->super_QArrayData,2,0x10);
                }
              }
              goto LAB_00392ae7;
            }
          }
LAB_003925cc:
          lVar21 = lVar21 + 0x68;
          lVar15 = lVar15 + -1;
        } while (lVar15 != 0);
      }
      bVar11 = lVar22 != lVar3;
      lVar22 = lVar22 + 1;
    } while (bVar11);
  }
  pDVar4 = (this->dtdAttributes).data;
  lVar22 = (this->dtdAttributes).tos;
  if (pDVar4 != pDVar4 + lVar22 + 1) {
    pDVar26 = pDVar4;
    do {
      if ((((pDVar26->isNamespaceAttribute == false) &&
           ((pDVar26->defaultValue).m_string != (QString *)0x0)) &&
          (bVar11 = QtPrivate::operator!=(&pDVar26->tagName,&this->qualifiedName), !bVar11)) &&
         ((pDVar26->attributeQualifiedName).m_string != (QString *)0x0)) {
        if (lVar3 < 0) {
          lVar15 = 0;
        }
        else {
          lVar23 = 0;
          lVar21 = 0;
          do {
            puVar1 = (undefined8 *)((long)&(((this->attributeStack).data)->key).pos + lVar23);
            local_a8._8_8_ = *puVar1;
            local_a8._16_8_ = puVar1[1];
            local_a8._0_8_ = &this->textBuffer;
            bVar11 = QtPrivate::operator!=
                               ((XmlStringRef *)local_a8,&pDVar26->attributeQualifiedName);
            lVar15 = lVar21;
            if (!bVar11) break;
            lVar21 = lVar21 + 1;
            lVar23 = lVar23 + 0x30;
            lVar15 = size;
          } while (lVar3 + 1 != lVar21);
        }
        if (lVar15 == size) {
          local_a8._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QXmlStreamAttribute::QXmlStreamAttribute((QXmlStreamAttribute *)local_a8);
          uVar10 = local_a8._0_8_;
          pQVar20 = (pDVar26->attributeName).m_string;
          if (pQVar20 == (QString *)0x0) {
            pQVar18 = (QArrayData *)0x0;
            local_a8._8_8_ = (char16_t *)0x0;
            local_a8._16_8_ = (undefined1 *)0x0;
          }
          else {
            pQVar18 = &((pQVar20->d).d)->super_QArrayData;
            local_a8._8_8_ = (pQVar20->d).ptr;
            if (pQVar18 != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&pQVar18->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)&pQVar18->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1
              ;
              UNLOCK();
            }
            local_a8._16_8_ = (pDVar26->attributeName).m_size;
            local_a8._8_8_ = local_a8._8_8_ + (pDVar26->attributeName).m_pos * 2;
          }
          if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              local_a8._0_8_ = pQVar18;
              QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
              pQVar18 = (QArrayData *)local_a8._0_8_;
            }
          }
          local_a8._0_8_ = pQVar18;
          uVar10 = local_a8._48_8_;
          pQVar20 = (pDVar26->attributeQualifiedName).m_string;
          if (pQVar20 == (QString *)0x0) {
            pQVar18 = (QArrayData *)0x0;
            local_a8._56_8_ = (char16_t *)0x0;
            local_a8._64_8_ = 0;
          }
          else {
            pQVar18 = &((pQVar20->d).d)->super_QArrayData;
            local_a8._56_8_ = (pQVar20->d).ptr;
            if (pQVar18 != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&pQVar18->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)&pQVar18->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1
              ;
              UNLOCK();
            }
            local_a8._64_8_ = (pDVar26->attributeQualifiedName).m_size;
            local_a8._56_8_ = local_a8._56_8_ + (pDVar26->attributeQualifiedName).m_pos * 2;
          }
          if ((QArrayData *)local_a8._48_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_a8._48_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_a8._48_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_a8._48_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              local_a8._48_8_ = pQVar18;
              QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
              pQVar18 = (QArrayData *)local_a8._48_8_;
            }
          }
          local_a8._48_8_ = pQVar18;
          uVar10 = local_a8._72_8_;
          pQVar20 = (pDVar26->defaultValue).m_string;
          if (pQVar20 == (QString *)0x0) {
            pQVar18 = (QArrayData *)0x0;
            local_a8._80_8_ = (char16_t *)0x0;
            local_a8._88_8_ = 0;
          }
          else {
            pQVar18 = &((pQVar20->d).d)->super_QArrayData;
            local_a8._80_8_ = (pQVar20->d).ptr;
            if (pQVar18 != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&pQVar18->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                   (((QArrayData *)&pQVar18->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1
              ;
              UNLOCK();
            }
            local_a8._88_8_ = (pDVar26->defaultValue).m_size;
            local_a8._80_8_ = local_a8._80_8_ + (pDVar26->defaultValue).m_pos * 2;
          }
          if ((QArrayData *)local_a8._72_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_a8._72_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_a8._72_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_a8._72_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              local_a8._72_8_ = pQVar18;
              QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
              pQVar18 = (QArrayData *)local_a8._72_8_;
            }
          }
          local_a8._72_8_ = pQVar18;
          lVar15 = (pDVar26->attributePrefix).m_size;
          pQVar18 = (QArrayData *)local_a8._24_8_;
          if (lVar15 != 0) {
            local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_c8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar20 = (pDVar26->attributePrefix).m_string;
            if (pQVar20 == (QString *)0x0) {
              lVar15 = 0;
              pcVar13 = (char16_t *)0x0;
            }
            else {
              pcVar13 = (pQVar20->d).ptr;
              if (pcVar13 == (char16_t *)0x0) {
                pcVar13 = &QString::_empty;
              }
              pcVar13 = pcVar13 + (pDVar26->attributePrefix).m_pos;
            }
            prefix_01.m_data = pcVar13;
            prefix_01.m_size = lVar15;
            namespaceForPrefix((XmlStringRef *)&local_c8,this,prefix_01);
            uVar10 = local_a8._24_8_;
            if (&(local_c8.d)->super_QArrayData == (QArrayData *)0x0) {
              pQVar18 = (QArrayData *)0x0;
              local_a8._32_8_ = (char16_t *)0x0;
              local_a8._40_8_ = (undefined1 *)0x0;
            }
            else {
              pQVar18 = *(QArrayData **)local_c8.d;
              lVar15 = *(qsizetype *)((long)local_c8.d + 8);
              if (pQVar18 != (QArrayData *)0x0) {
                LOCK();
                (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i =
                     (pQVar18->ref_)._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              local_a8._32_8_ = lVar15 + (long)local_c8.ptr * 2;
              local_a8._40_8_ = local_c8.size;
            }
            if ((QArrayData *)local_a8._24_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_a8._24_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_a8._24_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_a8._24_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                local_a8._24_8_ = pQVar18;
                QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
                pQVar18 = (QArrayData *)local_a8._24_8_;
              }
            }
          }
          local_a8._24_8_ = pQVar18;
          local_a8._96_8_ = local_a8._96_8_ | 1;
          QtPrivate::QMovableArrayOps<QXmlStreamAttribute>::emplace<QXmlStreamAttribute>
                    ((QMovableArrayOps<QXmlStreamAttribute> *)this_00,
                     (this->attributes).super_QList<QXmlStreamAttribute>.d.size,
                     (QXmlStreamAttribute *)local_a8);
          QList<QXmlStreamAttribute>::end(&this_00->super_QList<QXmlStreamAttribute>);
          if ((QArrayData *)local_a8._72_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_a8._72_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_a8._72_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_a8._72_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_a8._72_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_a8._48_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_a8._48_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_a8._48_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_a8._48_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_a8._48_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_a8._24_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_a8._24_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_a8._24_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_a8._24_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_a8._24_8_,2,0x10);
            }
          }
          if ((QArrayData *)local_a8._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
            }
          }
        }
      }
      bVar11 = pDVar26 != pDVar4 + lVar22;
      pDVar26 = pDVar26 + 1;
    } while (bVar11);
  }
LAB_00392ae7:
  (this->attributeStack).tos = -1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00392c1e:
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::resolveTag()
{
    const auto attributeStackCleaner = qScopeGuard([this](){ attributeStack.clear(); });
    const qsizetype n = attributeStack.size();

    if (namespaceProcessing) {
        for (DtdAttribute &dtdAttribute : dtdAttributes) {
            if (!dtdAttribute.isNamespaceAttribute
                || dtdAttribute.defaultValue.isNull()
                || dtdAttribute.tagName != qualifiedName
                || dtdAttribute.attributeQualifiedName.isNull())
                continue;
            qsizetype i = 0;
            while (i < n && symName(attributeStack[i].key) != dtdAttribute.attributeQualifiedName)
                ++i;
            if (i != n)
                continue;
            if (dtdAttribute.attributePrefix.isEmpty() && dtdAttribute.attributeName == "xmlns"_L1) {
                NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.push();
                namespaceDeclaration.prefix.clear();

                const XmlStringRef ns(dtdAttribute.defaultValue);
                if (ns == "http://www.w3.org/2000/xmlns/"_L1 ||
                   ns == "http://www.w3.org/XML/1998/namespace"_L1)
                    raiseWellFormedError(QXmlStream::tr("Illegal namespace declaration."));
                else
                    namespaceDeclaration.namespaceUri = ns;
            } else if (dtdAttribute.attributePrefix == "xmlns"_L1) {
                NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.push();
                XmlStringRef namespacePrefix = dtdAttribute.attributeName;
                XmlStringRef namespaceUri = dtdAttribute.defaultValue;
                if (((namespacePrefix == "xml"_L1)
                     ^ (namespaceUri == "http://www.w3.org/XML/1998/namespace"_L1))
                    || namespaceUri == "http://www.w3.org/2000/xmlns/"_L1
                    || namespaceUri.isEmpty()
                    || namespacePrefix == "xmlns"_L1)
                    raiseWellFormedError(QXmlStream::tr("Illegal namespace declaration."));

                namespaceDeclaration.prefix = namespacePrefix;
                namespaceDeclaration.namespaceUri = namespaceUri;
            }
        }
    }

    tagStack.top().namespaceDeclaration.namespaceUri = namespaceUri = namespaceForPrefix(prefix);

    attributes.resize(n);

    for (qsizetype i = 0; i < n; ++i) {
        QXmlStreamAttribute &attribute = attributes[i];
        Attribute &attrib = attributeStack[i];
        XmlStringRef prefix(symPrefix(attrib.key));
        XmlStringRef name(symString(attrib.key));
        XmlStringRef qualifiedName(symName(attrib.key));
        XmlStringRef value(symString(attrib.value));

        attribute.m_name = name;
        attribute.m_qualifiedName = qualifiedName;
        attribute.m_value = value;

        if (!prefix.isEmpty()) {
            XmlStringRef attributeNamespaceUri = namespaceForPrefix(prefix);
            attribute.m_namespaceUri = XmlStringRef(attributeNamespaceUri);
        }

        for (qsizetype j = 0; j < i; ++j) {
            if (attributes[j].name() == attribute.name()
                && attributes[j].namespaceUri() == attribute.namespaceUri()
                && (namespaceProcessing || attributes[j].qualifiedName() == attribute.qualifiedName()))
            {
                raiseWellFormedError(QXmlStream::tr("Attribute '%1' redefined.").arg(attribute.qualifiedName()));
                return;
            }
        }
    }

    for (DtdAttribute &dtdAttribute : dtdAttributes) {
        if (dtdAttribute.isNamespaceAttribute
            || dtdAttribute.defaultValue.isNull()
            || dtdAttribute.tagName != qualifiedName
            || dtdAttribute.attributeQualifiedName.isNull())
            continue;
        qsizetype i = 0;
        while (i < n && symName(attributeStack[i].key) != dtdAttribute.attributeQualifiedName)
            ++i;
        if (i != n)
            continue;



        QXmlStreamAttribute attribute;
        attribute.m_name = dtdAttribute.attributeName;
        attribute.m_qualifiedName = dtdAttribute.attributeQualifiedName;
        attribute.m_value = dtdAttribute.defaultValue;

        if (!dtdAttribute.attributePrefix.isEmpty()) {
            XmlStringRef attributeNamespaceUri = namespaceForPrefix(dtdAttribute.attributePrefix);
            attribute.m_namespaceUri = XmlStringRef(attributeNamespaceUri);
        }
        attribute.m_isDefault = true;
        attributes.append(std::move(attribute));
    }
}